

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

void socket_cb(uv_poll_t *poll,int status,int events)

{
  ssize_t sVar1;
  ssize_t cnt;
  int events_local;
  int status_local;
  uv_poll_t *poll_local;
  
  socket_cb_called = socket_cb_called + 1;
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x32,"0 == status");
    abort();
  }
  printf("Socket cb got events %d\n",(ulong)(uint)events);
  if ((events & 1U) == 1) {
    if ((socket_cb_read_fd != 0) &&
       (sVar1 = read(socket_cb_read_fd,socket_cb_read_buf,(long)socket_cb_read_size),
       sVar1 != socket_cb_read_size)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0x37,"cnt == socket_cb_read_size");
      abort();
    }
    uv_close((uv_handle_t *)poll,(uv_close_cb)0x0);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,0x34,"UV_READABLE == (events & UV_READABLE)");
  abort();
}

Assistant:

static void socket_cb(uv_poll_t* poll, int status, int events) {
  ssize_t cnt;
  socket_cb_called++;
  ASSERT(0 == status);
  printf("Socket cb got events %d\n", events);
  ASSERT(UV_READABLE == (events & UV_READABLE));
  if (socket_cb_read_fd) {
    cnt = read(socket_cb_read_fd, socket_cb_read_buf, socket_cb_read_size);
    ASSERT(cnt == socket_cb_read_size);
  }
  uv_close((uv_handle_t*) poll, NULL);
}